

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestResponseFiles::Run(ParserTestResponseFiles *this)

{
  Test *pTVar1;
  Rule *pRVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  *pmVar6;
  size_type sVar7;
  pointer ppVar8;
  string *__rhs;
  EvalString *pEVar9;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>
  local_28;
  Rule *local_20;
  Rule *rule;
  ParserTestResponseFiles *pPStack_10;
  int fail_count;
  ParserTestResponseFiles *this_local;
  
  pPStack_10 = this;
  rule._4_4_ = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat_rsp\n  command = cat $rspfile > $out\n  rspfile = $rspfile\n  rspfile_content = $in\n\nbuild out: cat_rsp in\n  rspfile=out.rsp\n"
            );
  iVar3 = rule._4_4_;
  iVar5 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar3 == iVar5) {
    pmVar6 = BindingEnv::GetRules_abi_cxx11_(&(this->super_ParserTest).state.bindings_);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
            ::size(pmVar6);
    bVar4 = testing::Test::Check
                      (pTVar1,sVar7 == 2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x77,"2u == state.bindings_.GetRules().size()");
    if (bVar4) {
      pmVar6 = BindingEnv::GetRules_abi_cxx11_(&(this->super_ParserTest).state.bindings_);
      local_28._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
           ::begin(pmVar6);
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>
               ::operator->(&local_28);
      pTVar1 = g_current_test;
      local_20 = ppVar8->second;
      __rhs = Rule::name_abi_cxx11_(local_20);
      bVar4 = std::operator==("cat_rsp",__rhs);
      testing::Test::Check
                (pTVar1,bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x79,"\"cat_rsp\" == rule->name()");
      pRVar2 = local_20;
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"command",&local_69);
      pEVar9 = Rule::GetBinding(pRVar2,&local_68);
      EvalString::Serialize_abi_cxx11_(&local_48,pEVar9);
      bVar4 = std::operator==("[cat ][$rspfile][ > ][$out]",&local_48);
      testing::Test::Check
                (pTVar1,bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x7b,
                 "\"[cat ][$rspfile][ > ][$out]\" == rule->GetBinding(\"command\")->Serialize()");
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
      pRVar2 = local_20;
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"rspfile",&local_c1);
      pEVar9 = Rule::GetBinding(pRVar2,&local_c0);
      EvalString::Serialize_abi_cxx11_(&local_a0,pEVar9);
      bVar4 = std::operator==("[$rspfile]",&local_a0);
      testing::Test::Check
                (pTVar1,bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x7c,"\"[$rspfile]\" == rule->GetBinding(\"rspfile\")->Serialize()");
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      pRVar2 = local_20;
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"rspfile_content",&local_109);
      pEVar9 = Rule::GetBinding(pRVar2,&local_108);
      EvalString::Serialize_abi_cxx11_(&local_e8,pEVar9);
      bVar4 = std::operator==("[$in]",&local_e8);
      testing::Test::Check
                (pTVar1,bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x7d,"\"[$in]\" == rule->GetBinding(\"rspfile_content\")->Serialize()");
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, ResponseFiles) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat_rsp\n"
"  command = cat $rspfile > $out\n"
"  rspfile = $rspfile\n"
"  rspfile_content = $in\n"
"\n"
"build out: cat_rsp in\n"
"  rspfile=out.rsp\n"));

  ASSERT_EQ(2u, state.bindings_.GetRules().size());
  const Rule* rule = state.bindings_.GetRules().begin()->second;
  EXPECT_EQ("cat_rsp", rule->name());
  EXPECT_EQ("[cat ][$rspfile][ > ][$out]",
            rule->GetBinding("command")->Serialize());
  EXPECT_EQ("[$rspfile]", rule->GetBinding("rspfile")->Serialize());
  EXPECT_EQ("[$in]", rule->GetBinding("rspfile_content")->Serialize());
}